

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> * __thiscall
spvtools::opt::MergeReturnPass::CollectReturnBlocks
          (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
           *__return_storage_ptr__,MergeReturnPass *this,Function *function)

{
  bool bVar1;
  Op OVar2;
  value_type local_70;
  undefined1 local_68 [16];
  Instruction *terminator;
  value_type *block;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  Function *function_local;
  MergeReturnPass *this_local;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *return_blocks;
  
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::vector
            (__return_storage_ptr__);
  join_0x00000010_0x00000000_ = opt::Function::begin(function);
  _block = opt::Function::end(function);
  while (bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                            &__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&block), bVar1)
  {
    terminator = (Instruction *)
                 UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                           ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                            &__end2.iterator_);
    BasicBlock::tail((BasicBlock *)local_68);
    local_68._8_8_ =
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*
                   ((iterator_template<spvtools::opt::Instruction> *)local_68);
    OVar2 = opt::Instruction::opcode((Instruction *)local_68._8_8_);
    if ((OVar2 == OpReturn) ||
       (OVar2 = opt::Instruction::opcode((Instruction *)local_68._8_8_), OVar2 == OpReturnValue)) {
      local_70 = (value_type)terminator;
      std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
      push_back(__return_storage_ptr__,&local_70);
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BasicBlock*> MergeReturnPass::CollectReturnBlocks(
    Function* function) {
  std::vector<BasicBlock*> return_blocks;
  for (auto& block : *function) {
    Instruction& terminator = *block.tail();
    if (terminator.opcode() == spv::Op::OpReturn ||
        terminator.opcode() == spv::Op::OpReturnValue) {
      return_blocks.push_back(&block);
    }
  }
  return return_blocks;
}